

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastF32S2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  uint uVar1;
  uint *puVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  ushort *puVar6;
  
  if (data.field_0._0_2_ != 0) {
    pcVar4 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar4;
  }
  uVar5 = hasbits | 1L << ((ulong)data.field_0 >> 0x10 & 0x3f);
  uVar1 = *(uint *)(ptr + 2);
  puVar2 = RefAt<unsigned_int>(msg,(ulong)data.field_0 >> 0x30);
  *puVar2 = uVar1;
  puVar6 = (ushort *)(ptr + 6);
  if (puVar6 < (ctx->super_EpsCopyInputStream).limit_end_) {
    uVar1 = (uint)table->fast_idx_mask & (uint)*puVar6;
    if ((uVar1 & 7) == 0) {
      uVar3 = (ulong)(uVar1 & 0xfffffff8);
      pcVar4 = (char *)(**(code **)(&table[1].has_bits_offset + uVar3))
                                 (msg,puVar6,ctx,
                                  (ulong)*puVar6 ^ *(ulong *)(&table[1].fast_idx_mask + uVar3 * 2),
                                  table,uVar5);
      return pcVar4;
    }
    protobuf_assumption_failed
              ("(idx & 7) == 0",
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
               ,0x44d);
  }
  if ((ulong)table->has_bits_offset != 0) {
    puVar2 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
    *puVar2 = *puVar2 | (uint)uVar5;
  }
  return (char *)puVar6;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastF32S2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularFixed<uint32_t, uint16_t>(
      PROTOBUF_TC_PARAM_PASS);
}